

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

void uv_close(uv_handle_t *handle,uv_close_cb close_cb)

{
  if ((handle->flags & 3) == 0) {
    handle->flags = handle->flags | 1;
    handle->close_cb = close_cb;
    switch(handle->type) {
    case UV_ASYNC:
      uv__async_close((uv_async_t *)handle);
      break;
    case UV_CHECK:
      uv__check_close((uv_check_t *)handle);
      break;
    case UV_FS_EVENT:
      uv__fs_event_close((uv_fs_event_t *)handle);
      break;
    case UV_FS_POLL:
      uv__fs_poll_close((uv_fs_poll_t *)handle);
      return;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                    ,0xb7,"void uv_close(uv_handle_t *, uv_close_cb)");
    case UV_IDLE:
      uv__idle_close((uv_idle_t *)handle);
      break;
    case UV_NAMED_PIPE:
      uv__pipe_close((uv_pipe_t *)handle);
      break;
    case UV_POLL:
      uv__poll_close((uv_poll_t *)handle);
      break;
    case UV_PREPARE:
      uv__prepare_close((uv_prepare_t *)handle);
      break;
    case UV_PROCESS:
      uv__process_close((uv_process_t *)handle);
      break;
    case UV_TCP:
      uv__tcp_close((uv_tcp_t *)handle);
      break;
    case UV_TIMER:
      uv__timer_close((uv_timer_t *)handle);
      break;
    case UV_TTY:
      uv__stream_close((uv_stream_t *)handle);
      break;
    case UV_UDP:
      uv__udp_close((uv_udp_t *)handle);
      break;
    case UV_SIGNAL:
      uv__signal_close((uv_signal_t *)handle);
      return;
    }
    uv__make_close_pending(handle);
    return;
  }
  __assert_fail("!uv__is_closing(handle)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                ,0x74,"void uv_close(uv_handle_t *, uv_close_cb)");
}

Assistant:

void uv_close(uv_handle_t* handle, uv_close_cb close_cb) {
  assert(!uv__is_closing(handle));

  handle->flags |= UV_HANDLE_CLOSING;
  handle->close_cb = close_cb;

  switch (handle->type) {
  case UV_NAMED_PIPE:
    uv__pipe_close((uv_pipe_t*)handle);
    break;

  case UV_TTY:
    uv__stream_close((uv_stream_t*)handle);
    break;

  case UV_TCP:
    uv__tcp_close((uv_tcp_t*)handle);
    break;

  case UV_UDP:
    uv__udp_close((uv_udp_t*)handle);
    break;

  case UV_PREPARE:
    uv__prepare_close((uv_prepare_t*)handle);
    break;

  case UV_CHECK:
    uv__check_close((uv_check_t*)handle);
    break;

  case UV_IDLE:
    uv__idle_close((uv_idle_t*)handle);
    break;

  case UV_ASYNC:
    uv__async_close((uv_async_t*)handle);
    break;

  case UV_TIMER:
    uv__timer_close((uv_timer_t*)handle);
    break;

  case UV_PROCESS:
    uv__process_close((uv_process_t*)handle);
    break;

  case UV_FS_EVENT:
    uv__fs_event_close((uv_fs_event_t*)handle);
    break;

  case UV_POLL:
    uv__poll_close((uv_poll_t*)handle);
    break;

  case UV_FS_POLL:
    uv__fs_poll_close((uv_fs_poll_t*)handle);
    /* Poll handles use file system requests, and one of them may still be
     * running. The poll code will call uv__make_close_pending() for us. */
    return;

  case UV_SIGNAL:
    uv__signal_close((uv_signal_t*) handle);
    /* Signal handles may not be closed immediately. The signal code will
     * itself close uv__make_close_pending whenever appropriate. */
    return;

  default:
    assert(0);
  }

  uv__make_close_pending(handle);
}